

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_9703::MemoryMappedFileTest_MapWithSize_Test::
~MemoryMappedFileTest_MapWithSize_Test(MemoryMappedFileTest_MapWithSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MemoryMappedFileTest, MapWithSize) {
  std::string filename = GetExecutableDir() + "/test";
  WriteFile(filename, "abc");
  MemoryMappedFile<> f;
  File file(filename, File::RDONLY);
  f.map(file, 2);
  EXPECT_EQ("ab", std::string(f.start(), 2));
  EXPECT_EQ(2u, f.size());
}